

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O2

void Abc_FrameDeallocate(Abc_Frame_t *p)

{
  Abc_Frame_t *pAVar1;
  void *__ptr;
  int i_1;
  int i_00;
  Vec_Ptr_t *pVVar2;
  int i;
  long lVar3;
  
  Rwt_ManGlobalStop();
  if (p->vAbcObjIds != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vAbcObjIds);
  }
  if (p->vCexVec != (Vec_Ptr_t *)0x0) {
    Vec_PtrFreeFree(p->vCexVec);
  }
  pVVar2 = p->vPoEquivs;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    for (lVar3 = 0; lVar3 < pVVar2->nSize; lVar3 = lVar3 + 1) {
      if ((Vec_Ptr_t *)pVVar2->pArray[lVar3] != (Vec_Ptr_t *)0x0) {
        Vec_PtrFree((Vec_Ptr_t *)pVVar2->pArray[lVar3]);
      }
    }
    Vec_PtrFree(pVVar2);
  }
  if (p->vStatuses != (Vec_Int_t *)0x0) {
    Vec_IntFree(p->vStatuses);
  }
  if ((Dec_Man_t *)p->pManDec != (Dec_Man_t *)0x0) {
    Dec_ManStop((Dec_Man_t *)p->pManDec);
  }
  if (p->dd != (DdManager *)0x0) {
    Extra_StopManager(p->dd);
  }
  if (p->vStore != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vStore);
  }
  if ((Aig_Man_t *)p->pSave1 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave1);
  }
  if ((Aig_Man_t *)p->pSave2 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave2);
  }
  if ((Aig_Man_t *)p->pSave3 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave3);
  }
  if ((Aig_Man_t *)p->pSave4 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave4);
  }
  if ((If_DsdMan_t *)p->pManDsd != (If_DsdMan_t *)0x0) {
    If_DsdManFree((If_DsdMan_t *)p->pManDsd,0);
  }
  if ((If_DsdMan_t *)p->pManDsd2 != (If_DsdMan_t *)0x0) {
    If_DsdManFree((If_DsdMan_t *)p->pManDsd2,0);
  }
  if (p->pNtkBackup != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(p->pNtkBackup);
  }
  pVVar2 = p->vPlugInComBinPairs;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    for (i_00 = 0; i_00 < pVVar2->nSize; i_00 = i_00 + 1) {
      __ptr = Vec_PtrEntry(pVVar2,i_00);
      free(__ptr);
      pVVar2 = p->vPlugInComBinPairs;
    }
    Vec_PtrFree(pVVar2);
  }
  Vec_IntFreeP(&p->vIndFlops);
  pVVar2 = p->vLTLProperties_global;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      p->vLTLProperties_global->pArray = (void **)0x0;
      pVVar2 = p->vLTLProperties_global;
      if (pVVar2 == (Vec_Ptr_t *)0x0) goto LAB_002f2ade;
    }
    free(pVVar2);
    p->vLTLProperties_global = (Vec_Ptr_t *)0x0;
  }
LAB_002f2ade:
  if (p->vSignalNames != (Vec_Ptr_t *)0x0) {
    Vec_PtrFreeFree(p->vSignalNames);
  }
  if (p->pSpecName != (char *)0x0) {
    free(p->pSpecName);
    p->pSpecName = (char *)0x0;
  }
  Abc_FrameDeleteAllNetworks(p);
  if (p->pDrivingCell != (char *)0x0) {
    free(p->pDrivingCell);
    p->pDrivingCell = (char *)0x0;
  }
  if (p->pCex2 != (Abc_Cex_t *)0x0) {
    free(p->pCex2);
    p->pCex2 = (Abc_Cex_t *)0x0;
  }
  if (p->pCex != (Abc_Cex_t *)0x0) {
    free(p->pCex);
    p->pCex = (Abc_Cex_t *)0x0;
  }
  Vec_IntFreeP(&p->pAbcWlcInv);
  Abc_NamDeref(s_GlobalFrame->pJsonStrs);
  Vec_WecFreeP(&s_GlobalFrame->vJsonObjs);
  Ndr_Delete(s_GlobalFrame->pNdr);
  pAVar1 = s_GlobalFrame;
  if (s_GlobalFrame->pNdrArray != (int *)0x0) {
    free(s_GlobalFrame->pNdrArray);
    pAVar1->pNdrArray = (int *)0x0;
  }
  Gia_ManStopP(&p->pGiaMiniAig);
  Gia_ManStopP(&p->pGiaMiniLut);
  Vec_IntFreeP(&p->vCopyMiniAig);
  Vec_IntFreeP(&p->vCopyMiniLut);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p->pBoxes);
  free(p);
  s_GlobalFrame = (Abc_Frame_t *)0x0;
  return;
}

Assistant:

void Abc_FrameDeallocate( Abc_Frame_t * p )
{
    extern void Rwt_ManGlobalStop();
    extern void undefine_cube_size();
//    extern void Ivy_TruthManStop();
//    Abc_HManStop();
//    undefine_cube_size();
    Rwt_ManGlobalStop();
//    Ivy_TruthManStop();
    if ( p->vAbcObjIds)  Vec_IntFree( p->vAbcObjIds );
    if ( p->vCexVec   )  Vec_PtrFreeFree( p->vCexVec );
    if ( p->vPoEquivs )  Vec_VecFree( (Vec_Vec_t *)p->vPoEquivs );
    if ( p->vStatuses )  Vec_IntFree( p->vStatuses );
    if ( p->pManDec   )  Dec_ManStop( (Dec_Man_t *)p->pManDec );
#ifdef ABC_USE_CUDD
    if ( p->dd        )  Extra_StopManager( p->dd );
#endif
    if ( p->vStore    )  Vec_PtrFree( p->vStore );
    if ( p->pSave1    )  Aig_ManStop( (Aig_Man_t *)p->pSave1 );
    if ( p->pSave2    )  Aig_ManStop( (Aig_Man_t *)p->pSave2 );
    if ( p->pSave3    )  Aig_ManStop( (Aig_Man_t *)p->pSave3 );
    if ( p->pSave4    )  Aig_ManStop( (Aig_Man_t *)p->pSave4 );
    if ( p->pManDsd   )  If_DsdManFree( (If_DsdMan_t *)p->pManDsd, 0 );
    if ( p->pManDsd2  )  If_DsdManFree( (If_DsdMan_t *)p->pManDsd2, 0 );
    if ( p->pNtkBackup)  Abc_NtkDelete( p->pNtkBackup );
    if ( p->vPlugInComBinPairs ) 
    {
        char * pTemp;
        int i;
        Vec_PtrForEachEntry( char *, p->vPlugInComBinPairs, pTemp, i )
            ABC_FREE( pTemp );
        Vec_PtrFree( p->vPlugInComBinPairs );
    }
    Vec_IntFreeP( &p->vIndFlops );
    Vec_PtrFreeP( &p->vLTLProperties_global );
    if ( p->vSignalNames )
    Vec_PtrFreeFree( p->vSignalNames );
    ABC_FREE( p->pSpecName );
    Abc_FrameDeleteAllNetworks( p );
    ABC_FREE( p->pDrivingCell );
    ABC_FREE( p->pCex2 );
    ABC_FREE( p->pCex );
    Vec_IntFreeP( &p->pAbcWlcInv );
    Abc_NamDeref( s_GlobalFrame->pJsonStrs );
    Vec_WecFreeP( &s_GlobalFrame->vJsonObjs );  
    Ndr_Delete( s_GlobalFrame->pNdr );
    ABC_FREE( s_GlobalFrame->pNdrArray );

    Gia_ManStopP( &p->pGiaMiniAig );
    Gia_ManStopP( &p->pGiaMiniLut );
    Vec_IntFreeP( &p->vCopyMiniAig );
    Vec_IntFreeP( &p->vCopyMiniLut );
    ABC_FREE( p->pArray );
    ABC_FREE( p->pBoxes );
    

    ABC_FREE( p );
    s_GlobalFrame = NULL;
}